

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O1

void __thiscall
QPixmapStyle::drawProgressBarLabel
          (QPixmapStyle *this,QStyleOption *option,QPainter *painter,QWidget *param_3)

{
  QStyle *in_RAX;
  QStyle *pQVar1;
  
  if (((option == (QStyleOption *)0x0) || (option->version < 1)) || (option->type != 6)) {
    option = (QStyleOption *)0x0;
  }
  if ((option != (QStyleOption *)0x0) &&
     (((option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i & 0x80) != 0)) {
    pQVar1 = QStyle::proxy(in_RAX);
    (**(code **)(*(long *)pQVar1 + 0x98))
              (pQVar1,painter,&option->rect,0x184,&option->palette,
               (option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
               super_QFlagsStorage<QStyle::StateFlag>.i & 1,&option[1].rect,8);
  }
  return;
}

Assistant:

void QPixmapStyle::drawProgressBarLabel(const QStyleOption *option,
                                        QPainter *painter, const QWidget *) const
{
    if (const QStyleOptionProgressBar *pb =
                    qstyleoption_cast<const QStyleOptionProgressBar *>(option)) {
        const bool vertical = !(pb->state & QStyle::State_Horizontal);
        if (!vertical) {
            QPalette::ColorRole textRole = QPalette::ButtonText;
            proxy()->drawItemText(painter, pb->rect,
                                  Qt::AlignCenter | Qt::TextSingleLine, pb->palette,
                                  pb->state & State_Enabled, pb->text, textRole);
        }
    }
}